

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O2

QString * qt_punycodeDecoder(QString *__return_storage_ptr__,QString *pc)

{
  char16_t cVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  qsizetype qVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char32_t __c;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QMessageLogger local_78;
  u32string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(pc->d).size < 0x40) {
    s.m_data = "xn--";
    s.m_size = 4;
    bVar3 = QString::startsWith(pc,s,CaseSensitive);
    if (bVar3) {
      qVar6 = QString::lastIndexOf(pc,(QChar)0x2d,CaseSensitive);
      local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_dataplus._M_p = (pointer)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      iVar12 = (int)qVar6;
      if (iVar12 < 4) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0xaaaaaaaa00000000;
      }
      else {
        QString::mid((QString *)&local_78,pc,4,(ulong)(iVar12 - 4));
        QString::toStdU32String_abi_cxx11_(&local_58,(QString *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      }
      uVar8 = iVar12 + 1;
      uVar5 = 0x48;
      __c = L'\x80';
      uVar11 = 0;
      while( true ) {
        uVar2 = (pc->d).size;
        uVar14 = (uint)uVar2;
        if (uVar14 <= uVar8) break;
        uVar7 = 1;
        uVar13 = 0x24;
        uVar10 = uVar11;
        for (uVar9 = (ulong)uVar8; uVar8 = uVar14, (uVar2 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1)
        {
          cVar1 = (pc->d).ptr[uVar9];
          if ((ushort)cVar1 - 0x30 < 10) {
            uVar8 = (ushort)cVar1 - 0x16;
          }
          else {
            uVar8 = (ushort)cVar1 - 0x41;
            if ((0x19 < uVar8) && (uVar8 = (ushort)cVar1 - 0x61, 0x19 < uVar8)) goto LAB_00245e61;
          }
          uVar4 = (uint)(uVar8 * uVar7);
          if (((int)(uVar8 * uVar7 >> 0x20) != 0) ||
             (bVar3 = CARRY4(uVar10,uVar4), uVar10 = uVar10 + uVar4, bVar3)) goto LAB_00245e61;
          uVar4 = uVar13 - uVar5;
          if (uVar5 + 0x1a <= uVar13) {
            uVar4 = 0x1a;
          }
          if (uVar13 <= uVar5) {
            uVar4 = 1;
          }
          if (uVar8 < uVar4) {
            uVar8 = (int)uVar9 + 1;
            break;
          }
          uVar7 = uVar7 * (0x24 - uVar4);
          if ((int)(uVar7 >> 0x20) != 0) goto LAB_00245e61;
          uVar7 = uVar7 & 0xffffffff;
          uVar13 = uVar13 + 0x24;
        }
        uVar14 = (int)local_58._M_string_length + 1;
        uVar5 = adapt(uVar10 - uVar11,uVar14,uVar11 == 0);
        bVar3 = CARRY4(__c,uVar10 / uVar14);
        __c = __c + uVar10 / uVar14;
        if (bVar3) {
LAB_00245e61:
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          goto LAB_00245e6c;
        }
        if ((uint)__c < 0x80) {
          local_78.context.version = 2;
          local_78.context.function._4_4_ = 0;
          local_78.context._4_8_ = 0;
          local_78.context._12_8_ = 0;
          local_78.context.category = "default";
          QMessageLogger::warning
                    (&local_78,"Attempt to insert a basic codepoint. Unhandled overflow?");
          goto LAB_00245e61;
        }
        if ((0x10ffff < (uint)__c) || ((__c & 0xfffff800U) == 0xd800)) goto LAB_00245e61;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::insert(&local_58,(ulong)uVar10 % (ulong)uVar14,1,__c);
        uVar11 = (int)((ulong)uVar10 % (ulong)uVar14) + 1;
      }
      QString::fromStdU32String(__return_storage_ptr__,&local_58);
LAB_00245e6c:
      std::__cxx11::u32string::~u32string((u32string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00245ee0:
        __stack_chk_fail();
      }
    }
    else {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00245ee0;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&pc->d);
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00245ee0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Q_AUTOTEST_EXPORT QString qt_punycodeDecoder(const QString &pc)
{
    uint n = initial_n;
    uint i = 0;
    uint bias = initial_bias;

    // Do not try to decode strings longer than allowable for a domain label.
    // Non-ASCII strings are not allowed here anyway, so there is no need
    // to account for surrogates.
    if (pc.size() > MaxDomainLabelLength)
        return QString();

    // strip any ACE prefix
    int start = pc.startsWith("xn--"_L1) ? 4 : 0;
    if (!start)
        return pc;

    // find the last delimiter character '-' in the input array. copy
    // all data before this delimiter directly to the output array.
    int delimiterPos = pc.lastIndexOf(u'-');
    auto output = delimiterPos < 4 ? std::u32string()
                                   : pc.mid(start, delimiterPos - start).toStdU32String();

    // if a delimiter was found, skip to the position after it;
    // otherwise start at the front of the input string. everything
    // before the delimiter is assumed to be basic code points.
    uint cnt = delimiterPos + 1;

    // loop through the rest of the input string, inserting non-basic
    // characters into output as we go.
    while (cnt < (uint) pc.size()) {
        uint oldi = i;
        uint w = 1;

        // find the next index for inserting a non-basic character.
        for (uint k = base; cnt < (uint) pc.size(); k += base) {
            // grab a character from the punycode input and find its
            // delta digit (each digit code is part of the
            // variable-length integer delta)
            uint digit = pc.at(cnt++).unicode();
            if (digit - 48 < 10) digit -= 22;
            else if (digit - 65 < 26) digit -= 65;
            else if (digit - 97 < 26) digit -= 97;
            else digit = base;

            // Fail if the code point has no digit value
            if (digit >= base)
                return QString();

            // i = i + digit * w, fail on overflow
            uint tmp;
            if (qMulOverflow<uint>(digit, w, &tmp) || qAddOverflow<uint>(i, tmp, &i))
                return QString();

            // detect threshold to stop reading delta digits
            uint t;
            if (k <= bias) t = tmin;
            else if (k >= bias + tmax) t = tmax;
            else t = k - bias;

            if (digit < t) break;

            // w = w * (base - t), fail on overflow
            if (qMulOverflow<uint>(w, base - t, &w))
                return QString();
        }

        // find new bias and calculate the next non-basic code
        // character.
        uint outputLength = static_cast<uint>(output.length());
        bias = adapt(i - oldi, outputLength + 1, oldi == 0);

        // n = n + i div (length(output) + 1), fail on overflow
        if (qAddOverflow<uint>(n, i / (outputLength + 1), &n))
            return QString();

        // allow the deltas to wrap around
        i %= (outputLength + 1);

        // if n is a basic code point then fail; this should not happen with
        // correct implementation of Punycode, but check just n case.
        if (n < initial_n) {
            // Don't use Q_ASSERT() to avoid possibility of DoS
            qWarning("Attempt to insert a basic codepoint. Unhandled overflow?");
            return QString();
        }

        // Surrogates should normally be rejected later by other IDNA code.
        // But because of Qt's use of UTF-16 to represent strings the
        // IDNA code is not able to distinguish characters represented as pairs
        // of surrogates from normal code points. This is why surrogates are
        // not allowed here.
        //
        // Allowing surrogates would lead to non-unique (after normalization)
        // encoding of strings with non-BMP characters.
        //
        // Punycode that encodes characters outside the Unicode range is also
        // invalid and is rejected here.
        if (QChar::isSurrogate(n) || n > QChar::LastValidCodePoint)
            return QString();

        // insert the character n at position i
        output.insert(i, 1, static_cast<char32_t>(n));
        ++i;
    }

    return QString::fromStdU32String(output);
}